

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameter.h
# Opt level: O0

bool __thiscall Parameter::create(Parameter *this,int argc,char **argv)

{
  char *pcVar1;
  typed_value<int,_char> *ptVar2;
  typed_value<double,_char> *ptVar3;
  char **argv_00;
  typed_value<int,_char> *ptVar4;
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *ext;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar5;
  typed_value<bool,_char> *ptVar6;
  variables_map *this_00;
  ostream *poVar7;
  exception *e;
  variables_map vm;
  options_description desc;
  key_type *__x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc20;
  allocator *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc38;
  undefined4 in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc44;
  int style;
  int argc_00;
  allocator local_279;
  string local_278 [36];
  undefined4 local_254;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  basic_parsed_options local_220 [40];
  variables_map local_1f8 [16];
  key_type local_1e8 [4];
  undefined1 local_153;
  undefined1 local_152;
  allocator local_151;
  string local_150 [39];
  allocator local_129;
  string local_128 [32];
  undefined4 local_108;
  undefined4 local_104;
  undefined4 local_100;
  undefined4 local_fc;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined4 local_e4;
  undefined8 local_e0 [3];
  allocator local_c1;
  string local_c0 [32];
  options_description local_a0 [159];
  byte local_1;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"Allowed options",&local_c1);
  boost::program_options::options_description::options_description
            (local_a0,local_c0,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  local_e0[0] = boost::program_options::options_description::add_options();
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)local_e0,"help");
  boost::program_options::value<int>((int *)in_stack_fffffffffffffc20);
  local_e4 = 10;
  ptVar2 = boost::program_options::typed_value<int,_char>::default_value
                     ((typed_value<int,_char> *)
                      CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                      (int *)in_stack_fffffffffffffc38);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)0x1a4707,(char *)ptVar2);
  boost::program_options::value<double>((double *)in_stack_fffffffffffffc20);
  local_f0 = 0x3fa999999999999a;
  ptVar3 = boost::program_options::typed_value<double,_char>::default_value
                     ((typed_value<double,_char> *)
                      CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                      (double *)in_stack_fffffffffffffc38);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"lambda",(char *)ptVar3);
  boost::program_options::value<double>((double *)in_stack_fffffffffffffc20);
  local_f8 = 0x3f50624dd2f1a9fc;
  ptVar3 = boost::program_options::typed_value<double,_char>::default_value
                     ((typed_value<double,_char> *)
                      CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                      (double *)in_stack_fffffffffffffc38);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)0x1a41ae,(char *)ptVar3);
  boost::program_options::value<int>((int *)in_stack_fffffffffffffc20);
  local_fc = 5;
  ptVar2 = boost::program_options::typed_value<int,_char>::default_value
                     ((typed_value<int,_char> *)
                      CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                      (int *)in_stack_fffffffffffffc38);
  argv_00 = (char **)boost::program_options::options_description_easy_init::operator()
                               (pcVar1,(value_semantic *)"max_iter",(char *)ptVar2);
  argc_00 = (int)((ulong)ptVar2 >> 0x20);
  ptVar2 = boost::program_options::value<int>((int *)in_stack_fffffffffffffc20);
  local_100 = 5;
  ptVar4 = boost::program_options::typed_value<int,_char>::default_value
                     ((typed_value<int,_char> *)
                      CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                      (int *)in_stack_fffffffffffffc38);
  ext = (function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
         *)boost::program_options::options_description_easy_init::operator()
                     ((char *)argv_00,(value_semantic *)"max_inner_iter",(char *)ptVar4);
  style = (int)((ulong)ptVar4 >> 0x20);
  boost::program_options::value<int>((int *)in_stack_fffffffffffffc20);
  local_104 = 1;
  ptVar4 = boost::program_options::typed_value<int,_char>::default_value
                     ((typed_value<int,_char> *)
                      CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                      (int *)in_stack_fffffffffffffc38);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)ext,(value_semantic *)"node",(char *)ptVar4);
  boost::program_options::value<int>((int *)in_stack_fffffffffffffc20);
  local_108 = 4;
  ptVar4 = boost::program_options::typed_value<int,_char>::default_value
                     ((typed_value<int,_char> *)
                      CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                      (int *)in_stack_fffffffffffffc38);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"thread",(char *)ptVar4);
  boost::program_options::value<std::__cxx11::string>(in_stack_fffffffffffffc20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,"../data/netflix/",&local_129);
  ptVar5 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value((typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
                            *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                           in_stack_fffffffffffffc38);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"data_folder",(char *)ptVar5);
  boost::program_options::value<std::__cxx11::string>(in_stack_fffffffffffffc20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"../output/netflix/",&local_151);
  ptVar5 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value((typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
                            *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                           in_stack_fffffffffffffc38);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"output_folder",(char *)ptVar5);
  boost::program_options::value<bool>((bool *)in_stack_fffffffffffffc20);
  local_152 = 1;
  ptVar6 = boost::program_options::typed_value<bool,_char>::default_value
                     ((typed_value<bool,_char> *)
                      CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                      (bool *)in_stack_fffffffffffffc38);
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"output",(char *)ptVar6);
  boost::program_options::value<bool>((bool *)in_stack_fffffffffffffc20);
  local_153 = 1;
  ptVar6 = boost::program_options::typed_value<bool,_char>::default_value
                     ((typed_value<bool,_char> *)
                      CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                      (bool *)in_stack_fffffffffffffc38);
  boost::program_options::options_description_easy_init::operator()
            (pcVar1,(value_semantic *)"verbose",(char *)ptVar6);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  boost::program_options::variables_map::variables_map(local_1f8);
  local_248 = 0;
  uStack_240 = 0;
  uStack_238 = 0;
  uStack_230 = 0;
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::function1((function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               *)0x171acb);
  boost::program_options::parse_command_line<char>
            (argc_00,argv_00,(options_description *)ptVar2,style,ext);
  boost::program_options::store(local_220,local_1f8,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options
            ((basic_parsed_options<char> *)0x171b1e);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1((function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)0x171b2b);
  boost::program_options::notify(local_1f8);
  __x = local_1e8;
  this_01 = &local_279;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_278,"help",this_01);
  this_00 = (variables_map *)
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)this_01,__x);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  local_1 = this_00 == (variables_map *)0x0;
  if (!(bool)local_1) {
    poVar7 = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,local_a0);
    std::operator<<(poVar7,"\n");
  }
  local_254 = 1;
  boost::program_options::variables_map::~variables_map(this_00);
  boost::program_options::options_description::~options_description((options_description *)this_00);
  return (bool)(local_1 & 1);
}

Assistant:

bool create(int argc, char **argv) {

        po::options_description desc("Allowed options");
        desc.add_options()
                ("help", "produce help message")
                ("k", po::value<int>(&(Parameter::k))->default_value(10), "dimensionality of latent vector")
                ("lambda", po::value<value_type>(&(Parameter::lambda))->default_value(0.05), "regularization weight")
                ("epsilon", po::value<value_type>(&(Parameter::eps))->default_value(1e-3), "inner termination criterion epsilon")
                ("max_iter", po::value<int>(&(Parameter::max_iter))->default_value(5), "number of iterations")
                ("max_inner_iter", po::value<int>(&(Parameter::max_inner_iter))->default_value(5), "number of inner iterations")
                ("node", po::value<int>(&(Parameter::num_of_machine))->default_value(1), "number of machines")
                ("thread", po::value<int>(&(Parameter::num_of_thread))->default_value(4), "number of thread per machine")
                ("data_folder", po::value<string>(&(Parameter::meta_path))->default_value("../data/netflix/"), "file path of data folder containing meta file")
                ("output_folder", po::value<string>(&(Parameter::output_path))->default_value("../output/netflix/"), "output folder path")
                ("output", po::value<bool>(&(Parameter::output))->default_value(true), "whether output row-wise latent vectors")
                ("verbose", po::value<bool>(&(Parameter::verbose))->default_value(true), "whether output information for debugging");

        po::variables_map vm;
        try {
            po::store(po::parse_command_line(argc, argv, desc), vm);
            po::notify(vm);
        } catch (std::exception &e) {
            cout << endl << e.what() << endl;
            cout << desc << endl;
            return 0;
        }

        if (vm.count("help")) {
            cout << desc << "\n";
            return false;
        } else {
            return true;
        }
    }